

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::EraFun::GetFunctions(void)

{
  duckdb *in_RDI;
  scalar_function_t local_68;
  scalar_function_t local_48;
  scalar_function_t local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::EraOperator>;
  local_28._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EraOperator>;
  local_48._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::EraOperator>;
  local_68._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_68.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,&local_28,&local_48,&local_68,
             DatePart::EraOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::EraOperator::PropagateStatistics<duckdb::timestamp_t>);
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

ScalarFunctionSet EraFun::GetFunctions() {
	return GetDatePartFunction<DatePart::EraOperator>();
}